

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

String * __thiscall
glcts::LayoutBindingBaseCase::buildLayout
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this,String *binding)

{
  ostream *poVar1;
  ostringstream s;
  ostream oStack_188;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_188);
  if (binding->_M_string_length != 0) {
    poVar1 = std::operator<<(&oStack_188,"layout(binding=");
    poVar1 = std::operator<<(poVar1,(string *)binding);
    std::operator<<(poVar1,") ");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_188);
  return __return_storage_ptr__;
}

Assistant:

virtual String buildLayout(const String& binding)
	{
		std::ostringstream s;
		if (!binding.empty())
			s << "layout(binding=" << binding << ") ";
		return s.str();
	}